

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

int cuddComputeFloorLog2(uint value)

{
  undefined4 local_10;
  undefined4 local_c;
  int floorLog;
  uint value_local;
  
  local_10 = 0;
  for (local_c = value; 1 < local_c; local_c = local_c >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

int
cuddComputeFloorLog2(
  unsigned int value)
{
    int floorLog = 0;
#ifdef DD_DEBUG
    assert(value > 0);
#endif
    while (value > 1) {
        floorLog++;
        value >>= 1;
    }
    return(floorLog);

}